

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O2

int dwarf_get_INL_name(uint val,char **s_out)

{
  if (val < 4) {
    *s_out = &DAT_00200118 + *(int *)(&DAT_00200118 + (ulong)val * 4);
    return 0;
  }
  return -1;
}

Assistant:

int
dwarf_get_INL_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_INL_not_inlined:
        *s_out = "DW_INL_not_inlined";
        return DW_DLV_OK;
    case DW_INL_inlined:
        *s_out = "DW_INL_inlined";
        return DW_DLV_OK;
    case DW_INL_declared_not_inlined:
        *s_out = "DW_INL_declared_not_inlined";
        return DW_DLV_OK;
    case DW_INL_declared_inlined:
        *s_out = "DW_INL_declared_inlined";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}